

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O3

void __thiscall
MeshSplitter::SplitMesh
          (MeshSplitter *this,uint a,aiMesh *in_mesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  aiColor4D *paVar1;
  pointer *pppVar2;
  uint uVar3;
  aiVector3D *paVar4;
  pointer ppVar5;
  aiBone *paVar6;
  iterator iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  pointer paVar23;
  pointer paVar24;
  uint c_2;
  int iVar25;
  uint uVar26;
  uint uVar27;
  VertexWeightTable *pVVar28;
  aiVertexWeight aVar29;
  aiBone **ppaVar30;
  aiVector3D *paVar31;
  aiColor4D *paVar32;
  void *pvVar33;
  uint *puVar34;
  aiBone *paVar35;
  aiBone *paVar36;
  ulong uVar37;
  aiVertexWeight *__s;
  ulong *puVar38;
  aiFace *paVar39;
  uint uVar40;
  aiFace *paVar41;
  ulong uVar42;
  uint c;
  long lVar43;
  aiBone ***pppaVar44;
  pointer ppVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  pointer *pppVar49;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> was_copied_to;
  aiBone **local_4d8;
  int local_4d0;
  vector<aiFace,_std::allocator<aiFace>_> local_4a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_488;
  VertexWeightTable *local_468;
  char *local_460;
  vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>> *local_458
  ;
  ulong local_450;
  MeshSplitter *local_448;
  aiVector3D **local_440;
  undefined1 local_438 [8];
  uint *puStack_430;
  
  if (in_mesh->mNumVertices <= this->LIMIT) {
    puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
    iVar7._M_current =
         (source_mesh_map->
         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current !=
        (source_mesh_map->
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar7._M_current)->first = in_mesh;
      *(uint **)&(iVar7._M_current)->second = puStack_430;
      pppVar2 = &(source_mesh_map->
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + 1;
      return;
    }
    local_438 = (undefined1  [8])in_mesh;
    std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
    _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
              ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                *)source_mesh_map,iVar7,(pair<aiMesh_*,_unsigned_int> *)local_438);
    return;
  }
  pVVar28 = ComputeVertexBoneWeightTable(in_mesh);
  uVar27 = in_mesh->mNumVertices;
  uVar3 = this->LIMIT;
  local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._0_4_ = 0xffffffff;
  local_448 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_488,(ulong)uVar27,(value_type_conflict1 *)local_438);
  uVar47 = (ulong)in_mesh->mNumFaces / (ulong)(uVar27 / uVar3 + 1);
  local_450 = (ulong)(uint)((int)(uVar47 >> 3) + (int)uVar47);
  local_460 = (in_mesh->mName).data;
  uVar47 = 0;
  local_468 = pVVar28;
  local_458 = (vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
               *)source_mesh_map;
  do {
    uVar27 = local_448->LIMIT;
    aVar29 = (aiVertexWeight)operator_new(0x520);
    *(uint *)aVar29 = 0;
    *(uint *)((long)aVar29 + 8) = 0;
    local_440 = (aiVector3D **)((long)aVar29 + 0x10);
    memset(local_440,0,0xcc);
    *(aiBone ***)((long)aVar29 + 0xe0) = (aiBone **)0x0;
    *(undefined8 *)((long)aVar29 + 0xe8) = 0;
    *(char *)((long)aVar29 + 0xf0) = '\0';
    memset((char *)((long)aVar29 + 0xf1),0x1b,0x3ff);
    *(uint *)((long)aVar29 + 0x4f0) = 0;
    *(aiAnimMesh ***)((long)aVar29 + 0x4f8) = (aiAnimMesh **)0x0;
    *(undefined8 *)((long)aVar29 + 0x500) = 0;
    *(undefined8 *)((long)aVar29 + 0x508) = 0;
    ((aiVector3D *)((long)aVar29 + 0x510))->x = 0.0;
    ((aiVector3D *)((long)aVar29 + 0x510))->y = 0.0;
    *(float *)((long)aVar29 + 0x518) = 0.0;
    *(uint *)((long)aVar29 + 4) = 0;
    memset((aiColor4D **)((long)aVar29 + 0x30),0,0xa0);
    *(uint *)((long)aVar29 + 0xe8) = in_mesh->mMaterialIndex;
    if (aVar29 != (aiVertexWeight)in_mesh) {
      uVar3 = (in_mesh->mName).length;
      ((aiString *)((long)aVar29 + 0xec))->length = uVar3;
      memcpy((char *)((long)aVar29 + 0xf0),local_460,(ulong)uVar3);
      ((char *)((long)aVar29 + 0xf0))[uVar3] = '\0';
    }
    pppaVar44 = (aiBone ***)((long)aVar29 + 0xe0);
    if (in_mesh->mNumBones != 0 && in_mesh->mBones != (aiBone **)0x0) {
      uVar46 = (ulong)in_mesh->mNumBones << 3;
      ppaVar30 = (aiBone **)operator_new__(uVar46);
      memset(ppaVar30,0,uVar46);
      *pppaVar44 = ppaVar30;
    }
    local_4d0 = (int)uVar47;
    if ((local_4d0 != 0) &&
       (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      memset(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,
             ((long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
              (-4 - (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
    }
    local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar3 = in_mesh->mNumVertices;
    uVar46 = (ulong)uVar27;
    if (uVar3 != 0 && in_mesh->mVertices != (aiVector3D *)0x0) {
      paVar31 = (aiVector3D *)operator_new__(uVar46 * 0xc);
      if (uVar27 != 0) {
        memset(paVar31,0,((uVar46 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *local_440 = paVar31;
    }
    if (in_mesh->mNormals != (aiVector3D *)0x0 && uVar3 != 0) {
      paVar31 = (aiVector3D *)operator_new__(uVar46 * 0xc);
      if (uVar27 != 0) {
        memset(paVar31,0,((uVar46 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(aiVector3D **)((long)aVar29 + 0x18) = paVar31;
    }
    if ((in_mesh->mBitangents == (aiVector3D *)0x0 || in_mesh->mTangents == (aiVector3D *)0x0) ||
        uVar3 == 0) {
      if (uVar3 != 0) goto LAB_003a6ea6;
    }
    else {
      uVar42 = uVar46 * 0xc;
      paVar31 = (aiVector3D *)operator_new__(uVar42);
      if (uVar27 != 0) {
        memset(paVar31,0,((uVar42 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(aiVector3D **)((long)aVar29 + 0x20) = paVar31;
      paVar31 = (aiVector3D *)operator_new__(uVar42);
      if (uVar27 != 0) {
        memset(paVar31,0,((uVar42 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(aiVector3D **)((long)aVar29 + 0x28) = paVar31;
LAB_003a6ea6:
      lVar43 = 0;
      do {
        if (in_mesh->mColors[lVar43] == (aiColor4D *)0x0) break;
        paVar32 = (aiColor4D *)operator_new__(uVar46 << 4);
        if (uVar27 != 0) {
          memset(paVar32,0,uVar46 << 4);
        }
        ((aiColor4D **)((long)aVar29 + 0x30))[lVar43] = paVar32;
        lVar43 = lVar43 + 1;
      } while (lVar43 != 8);
      if (uVar3 != 0) {
        lVar43 = 0;
        do {
          if (*(long *)((long)in_mesh->mTextureCoords + lVar43 * 2) == 0) break;
          *(undefined4 *)((long)((long)aVar29 + 0xb0) + lVar43) =
               *(undefined4 *)((long)in_mesh->mNumUVComponents + lVar43);
          pvVar33 = operator_new__(uVar46 * 0xc);
          if (uVar27 != 0) {
            memset(pvVar33,0,((uVar46 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(void **)((long)((long)aVar29 + 0x70) + lVar43 * 2) = pvVar33;
          lVar43 = lVar43 + 4;
        } while (lVar43 != 0x20);
      }
    }
    std::vector<aiFace,_std::allocator<aiFace>_>::reserve(&local_4a8,local_450);
    uVar47 = uVar47 & 0xffffffff;
    do {
      if (in_mesh->mNumFaces <= uVar47) break;
      uVar3 = in_mesh->mFaces[uVar47].mNumIndices;
      uVar46 = (ulong)uVar3;
      if (uVar46 == 0) {
        iVar25 = 0;
      }
      else {
        uVar42 = 0;
        iVar25 = 0;
        do {
          iVar25 = iVar25 + (uint)(local_488.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [in_mesh->mFaces[uVar47].mIndices[uVar42]] == 0xffffffff);
          uVar42 = uVar42 + 1;
        } while (uVar46 != uVar42);
      }
      if (uVar27 < iVar25 + *(uint *)((long)aVar29 + 4)) break;
      local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffff00000000);
      puStack_430 = (uint *)0x0;
      std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                (&local_4a8,(aiFace *)local_438);
      if (puStack_430 != (uint *)0x0) {
        operator_delete__(puStack_430);
      }
      paVar23 = local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].mNumIndices = uVar3;
      puVar34 = (uint *)operator_new__(uVar46 * 4);
      paVar23[-1].mIndices = puVar34;
      uVar40 = paVar23[-1].mNumIndices - 1;
      uVar26 = 8;
      if (uVar40 < 3) {
        uVar26 = *(uint *)(&DAT_006b5998 + (ulong)uVar40 * 4);
      }
      *(uint *)aVar29 = uVar26 | *(uint *)aVar29;
      if (uVar3 != 0) {
        uVar42 = 0;
        do {
          uVar3 = in_mesh->mFaces[uVar47].mIndices[uVar42];
          if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3] == 0xffffffff) {
            paVar31 = in_mesh->mVertices;
            paVar4 = *(aiVector3D **)((long)aVar29 + 0x10);
            uVar26 = *(uint *)((long)aVar29 + 4);
            paVar4[uVar26].z = paVar31[uVar3].z;
            paVar31 = paVar31 + uVar3;
            fVar8 = paVar31->y;
            paVar4 = paVar4 + uVar26;
            paVar4->x = paVar31->x;
            paVar4->y = fVar8;
            paVar31 = in_mesh->mNormals;
            if ((paVar31 != (aiVector3D *)0x0) && (in_mesh->mNumVertices != 0)) {
              paVar4 = *(aiVector3D **)((long)aVar29 + 0x18);
              uVar26 = *(uint *)((long)aVar29 + 4);
              paVar4[uVar26].z = paVar31[uVar3].z;
              fVar8 = paVar31[uVar3].y;
              paVar4 = paVar4 + uVar26;
              paVar4->x = paVar31[uVar3].x;
              paVar4->y = fVar8;
            }
            paVar31 = in_mesh->mTangents;
            if (((paVar31 != (aiVector3D *)0x0) && (in_mesh->mBitangents != (aiVector3D *)0x0)) &&
               (in_mesh->mNumVertices != 0)) {
              paVar4 = *(aiVector3D **)((long)aVar29 + 0x20);
              uVar26 = *(uint *)((long)aVar29 + 4);
              paVar4[uVar26].z = paVar31[uVar3].z;
              fVar8 = paVar31[uVar3].y;
              paVar4 = paVar4 + uVar26;
              paVar4->x = paVar31[uVar3].x;
              paVar4->y = fVar8;
              paVar31 = in_mesh->mBitangents;
              paVar4 = *(aiVector3D **)((long)aVar29 + 0x28);
              uVar26 = *(uint *)((long)aVar29 + 4);
              paVar4[uVar26].z = paVar31[uVar3].z;
              paVar31 = paVar31 + uVar3;
              fVar8 = paVar31->y;
              paVar4 = paVar4 + uVar26;
              paVar4->x = paVar31->x;
              paVar4->y = fVar8;
            }
            lVar43 = 0;
            do {
              paVar31 = in_mesh->mTextureCoords[lVar43];
              if ((paVar31 != (aiVector3D *)0x0) && (in_mesh->mNumVertices != 0)) {
                paVar4 = ((aiVector3D **)((long)aVar29 + 0x70))[lVar43];
                uVar26 = *(uint *)((long)aVar29 + 4);
                paVar4[uVar26].z = paVar31[uVar3].z;
                fVar8 = paVar31[uVar3].y;
                paVar4 = paVar4 + uVar26;
                paVar4->x = paVar31[uVar3].x;
                paVar4->y = fVar8;
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 != 8);
            lVar43 = 0;
            do {
              if ((in_mesh->mColors[lVar43] != (aiColor4D *)0x0) && (in_mesh->mNumVertices != 0)) {
                paVar32 = in_mesh->mColors[lVar43] + uVar3;
                fVar8 = paVar32->g;
                fVar9 = paVar32->b;
                fVar10 = paVar32->a;
                paVar1 = ((aiColor4D **)((long)aVar29 + 0x30))[lVar43] + *(uint *)((long)aVar29 + 4)
                ;
                paVar1->r = paVar32->r;
                paVar1->g = fVar8;
                paVar1->b = fVar9;
                paVar1->a = fVar10;
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 != 8);
            uVar26 = *(uint *)((long)aVar29 + 4);
            paVar23[-1].mIndices[uVar42] = uVar26;
            if (pVVar28 != (VertexWeightTable *)0x0) {
              ppVar45 = local_468[uVar26].
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar5 = local_468[uVar26].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (ppVar45 != ppVar5) {
                do {
                  ppaVar30 = *pppaVar44;
                  paVar35 = ppaVar30[ppVar45->first];
                  if (paVar35 == (aiBone *)0x0) {
                    paVar35 = (aiBone *)operator_new(0x18);
                    (paVar35->mName).length = 0;
                    (paVar35->mName).data[0] = '\0';
                    (paVar35->mName).data[1] = '\0';
                    (paVar35->mName).data[2] = '\0';
                    (paVar35->mName).data[3] = '\0';
                    (paVar35->mName).data[4] = '\0';
                    (paVar35->mName).data[5] = '\0';
                    (paVar35->mName).data[6] = '\0';
                    (paVar35->mName).data[7] = '\0';
                    (paVar35->mName).data[8] = '\0';
                    (paVar35->mName).data[9] = '\0';
                    (paVar35->mName).data[10] = '\0';
                    (paVar35->mName).data[0xb] = '\0';
                    (paVar35->mName).data[0xc] = '\0';
                    (paVar35->mName).data[0xd] = '\0';
                    (paVar35->mName).data[0xe] = '\0';
                    (paVar35->mName).data[0xf] = '\0';
                    (paVar35->mName).data[0x10] = '\0';
                    (paVar35->mName).data[0x11] = '\0';
                    (paVar35->mName).data[0x12] = '\0';
                    (paVar35->mName).data[0x13] = '\0';
                    ppaVar30[ppVar45->first] = paVar35;
                  }
                  local_438._4_4_ = ppVar45->second;
                  local_438._0_4_ = *(uint *)((long)aVar29 + 4);
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                  emplace_back<aiVertexWeight>
                            ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar35,
                             (aiVertexWeight *)local_438);
                  ppVar45 = ppVar45 + 1;
                } while (ppVar45 != ppVar5);
                uVar26 = *(uint *)((long)aVar29 + 4);
              }
            }
            local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3] = uVar26;
            *(uint *)((long)aVar29 + 4) = *(uint *)((long)aVar29 + 4) + 1;
          }
          else {
            paVar23[-1].mIndices[uVar42] =
                 local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3];
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar46);
      }
      uVar47 = uVar47 + 1;
    } while (*(uint *)((long)aVar29 + 4) != uVar27);
    uVar27 = in_mesh->mNumBones;
    if (uVar27 != 0 && in_mesh->mBones != (aiBone **)0x0) {
      local_4d8 = *(aiBone ***)((long)aVar29 + 0xe0);
      uVar46 = 0;
      do {
        paVar35 = (*pppaVar44)[uVar46];
        if (paVar35 != (aiBone *)0x0) {
          paVar6 = in_mesh->mBones[uVar46];
          paVar36 = (aiBone *)operator_new(0x460);
          (paVar36->mName).length = 0;
          (paVar36->mName).data[0] = '\0';
          memset((paVar36->mName).data + 1,0x1b,0x3ff);
          paVar36->mNumWeights = 0;
          paVar36->mWeights = (aiVertexWeight *)0x0;
          (paVar36->mOffsetMatrix).a1 = 1.0;
          (paVar36->mOffsetMatrix).a2 = 0.0;
          (paVar36->mOffsetMatrix).a3 = 0.0;
          (paVar36->mOffsetMatrix).a4 = 0.0;
          (paVar36->mOffsetMatrix).b1 = 0.0;
          (paVar36->mOffsetMatrix).b2 = 1.0;
          (paVar36->mOffsetMatrix).b3 = 0.0;
          (paVar36->mOffsetMatrix).b4 = 0.0;
          (paVar36->mOffsetMatrix).c1 = 0.0;
          (paVar36->mOffsetMatrix).c2 = 0.0;
          (paVar36->mOffsetMatrix).c3 = 1.0;
          (paVar36->mOffsetMatrix).c4 = 0.0;
          (paVar36->mOffsetMatrix).d1 = 0.0;
          (paVar36->mOffsetMatrix).d2 = 0.0;
          (paVar36->mOffsetMatrix).d3 = 0.0;
          (paVar36->mOffsetMatrix).d4 = 1.0;
          *local_4d8 = paVar36;
          uVar27 = (paVar6->mName).length;
          if (0x3fe < uVar27) {
            uVar27 = 0x3ff;
          }
          uVar42 = (ulong)uVar27;
          local_438._0_4_ = uVar27;
          memcpy(local_438 + 4,(paVar6->mName).data,uVar42);
          local_438[uVar42 + 4] = 0;
          (paVar36->mName).length = uVar27;
          memcpy((paVar36->mName).data,local_438 + 4,uVar42);
          (paVar36->mName).data[uVar42] = '\0';
          fVar19 = (paVar6->mOffsetMatrix).a1;
          fVar20 = (paVar6->mOffsetMatrix).a2;
          fVar21 = (paVar6->mOffsetMatrix).a3;
          fVar22 = (paVar6->mOffsetMatrix).a4;
          fVar15 = (paVar6->mOffsetMatrix).b1;
          fVar16 = (paVar6->mOffsetMatrix).b2;
          fVar17 = (paVar6->mOffsetMatrix).b3;
          fVar18 = (paVar6->mOffsetMatrix).b4;
          fVar11 = (paVar6->mOffsetMatrix).c1;
          fVar12 = (paVar6->mOffsetMatrix).c2;
          fVar13 = (paVar6->mOffsetMatrix).c3;
          fVar14 = (paVar6->mOffsetMatrix).c4;
          fVar8 = (paVar6->mOffsetMatrix).d2;
          fVar9 = (paVar6->mOffsetMatrix).d3;
          fVar10 = (paVar6->mOffsetMatrix).d4;
          (paVar36->mOffsetMatrix).d1 = (paVar6->mOffsetMatrix).d1;
          (paVar36->mOffsetMatrix).d2 = fVar8;
          (paVar36->mOffsetMatrix).d3 = fVar9;
          (paVar36->mOffsetMatrix).d4 = fVar10;
          (paVar36->mOffsetMatrix).c1 = fVar11;
          (paVar36->mOffsetMatrix).c2 = fVar12;
          (paVar36->mOffsetMatrix).c3 = fVar13;
          (paVar36->mOffsetMatrix).c4 = fVar14;
          (paVar36->mOffsetMatrix).b1 = fVar15;
          (paVar36->mOffsetMatrix).b2 = fVar16;
          (paVar36->mOffsetMatrix).b3 = fVar17;
          (paVar36->mOffsetMatrix).b4 = fVar18;
          (paVar36->mOffsetMatrix).a1 = fVar19;
          (paVar36->mOffsetMatrix).a2 = fVar20;
          (paVar36->mOffsetMatrix).a3 = fVar21;
          (paVar36->mOffsetMatrix).a4 = fVar22;
          uVar48 = *(long *)((paVar35->mName).data + 4) - *(long *)&paVar35->mName;
          uVar37 = (long)uVar48 >> 3;
          paVar36->mNumWeights = (uint)uVar37;
          uVar37 = uVar37 & 0xffffffff;
          uVar42 = uVar37 * 8;
          __s = (aiVertexWeight *)operator_new__(uVar42);
          if (uVar37 != 0) {
            memset(__s,0,uVar42);
          }
          paVar36->mWeights = __s;
          memcpy(__s,*(void **)&paVar35->mName,uVar48 & 0x7fffffff8);
          pvVar33 = *(void **)&paVar35->mName;
          if (pvVar33 != (void *)0x0) {
            operator_delete(pvVar33,*(long *)((paVar35->mName).data + 0xc) - (long)pvVar33);
          }
          local_4d8 = local_4d8 + 1;
          operator_delete(paVar35,0x18);
          *(uint *)((long)aVar29 + 0xd8) = *(uint *)((long)aVar29 + 0xd8) + 1;
          uVar27 = in_mesh->mNumBones;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < uVar27);
    }
    paVar24 = local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_finish;
    paVar23 = local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar46 = (long)local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar42 = (long)uVar46 >> 4;
    puVar38 = (ulong *)operator_new__(-(ulong)(uVar42 >> 0x3c != 0) | uVar46 | 8);
    *puVar38 = uVar42;
    paVar39 = (aiFace *)(puVar38 + 1);
    if (paVar24 != paVar23) {
      paVar41 = paVar39;
      do {
        paVar41->mNumIndices = 0;
        paVar41->mIndices = (uint *)0x0;
        paVar41 = paVar41 + 1;
      } while (paVar41 != (aiFace *)(uVar46 + (long)paVar39));
    }
    *(aiFace **)((long)aVar29 + 0xd0) = paVar39;
    *(uint *)((long)aVar29 + 8) = (uint)uVar42;
    if ((uint)uVar42 != 0) {
      lVar43 = 0;
      uVar46 = 0;
      do {
        aiFace::operator=((aiFace *)
                          ((long)&(*(aiFace **)((long)aVar29 + 0xd0))->mNumIndices + lVar43),
                          (aiFace *)
                          ((long)&(local_4a8.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar43))
        ;
        uVar46 = uVar46 + 1;
        lVar43 = lVar43 + 0x10;
      } while (uVar46 < *(uint *)((long)aVar29 + 8));
    }
    puStack_430 = (uint *)CONCAT44(puStack_430._4_4_,a);
    iVar7._M_current = *(pair<aiMesh_*,_unsigned_int> **)(local_458 + 8);
    local_438 = (undefined1  [8])aVar29;
    if (iVar7._M_current == *(pair<aiMesh_*,_unsigned_int> **)(local_458 + 0x10)) {
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                (local_458,iVar7,(pair<aiMesh_*,_unsigned_int> *)local_438);
    }
    else {
      (iVar7._M_current)->first = (aiMesh *)aVar29;
      *(uint **)&(iVar7._M_current)->second = puStack_430;
      *(long *)(local_458 + 8) = *(long *)(local_458 + 8) + 0x10;
    }
    uVar27 = in_mesh->mNumFaces;
    std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_4a8);
  } while (uVar27 != (uint)uVar47);
  if (pVVar28 != (VertexWeightTable *)0x0) {
    pppVar49 = &pVVar28[-1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar45 = local_468[-1].
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppVar45 != (pointer)0x0) {
      lVar43 = (long)ppVar45 * 0x18;
      do {
        pvVar33 = *(void **)((long)&pVVar28[-1].
                                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar43);
        if (pvVar33 != (void *)0x0) {
          operator_delete(pvVar33,*(long *)((long)pppVar49 + lVar43) - (long)pvVar33);
        }
        lVar43 = lVar43 + -0x18;
      } while (lVar43 != 0);
    }
    operator_delete__(pppVar49,(long)ppVar45 * 0x18 + 8);
    if (in_mesh == (aiMesh *)0x0) goto LAB_003a766d;
  }
  aiMesh::~aiMesh(in_mesh);
LAB_003a766d:
  operator_delete(in_mesh,0x520);
  if (local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MeshSplitter :: SplitMesh(unsigned int a, aiMesh* in_mesh, std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	if (in_mesh->mNumVertices <= LIMIT)	{
		source_mesh_map.push_back(std::make_pair(in_mesh,a));
		return;
	}

	// build a per-vertex weight list if necessary
	VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(in_mesh);

	// we need to split this mesh into sub meshes. Estimate submesh size
	const unsigned int sub_meshes = (in_mesh->mNumVertices / LIMIT) + 1;

	// create a std::vector<unsigned int> to remember which vertices have already 
	// been copied and to which position (i.e. output index)
	std::vector<unsigned int> was_copied_to;
	was_copied_to.resize(in_mesh->mNumVertices,WAS_NOT_COPIED);

	// Try to find a good estimate for the number of output faces
	// per mesh. Add 12.5% as buffer
	unsigned int size_estimated = in_mesh->mNumFaces / sub_meshes;
	size_estimated += size_estimated / 8;

	// now generate all submeshes
	unsigned int base = 0;
	while (true) {
		const unsigned int out_vertex_index = LIMIT;

		aiMesh* out_mesh = new aiMesh();			
		out_mesh->mNumVertices = 0;
		out_mesh->mMaterialIndex = in_mesh->mMaterialIndex;

		// the name carries the adjacency information between the meshes
		out_mesh->mName = in_mesh->mName;

		typedef std::vector<aiVertexWeight> BoneWeightList;
		if (in_mesh->HasBones())	{
			out_mesh->mBones = new aiBone*[in_mesh->mNumBones]();
		}

		// clear the temporary helper array
		if (base)	{
			std::fill(was_copied_to.begin(), was_copied_to.end(), WAS_NOT_COPIED);
		}

		std::vector<aiFace> vFaces;

		// reserve enough storage for most cases
		if (in_mesh->HasPositions()) {
			out_mesh->mVertices = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasNormals()) {
			out_mesh->mNormals = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasTangentsAndBitangents())	{
			out_mesh->mTangents = new aiVector3D[out_vertex_index];
			out_mesh->mBitangents = new aiVector3D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasVertexColors(c);++c)	{
			out_mesh->mColors[c] = new aiColor4D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasTextureCoords(c);++c)	{
			out_mesh->mNumUVComponents[c] = in_mesh->mNumUVComponents[c];
			out_mesh->mTextureCoords[c] = new aiVector3D[out_vertex_index];
		}
		vFaces.reserve(size_estimated);

		// (we will also need to copy the array of indices)
		while (base < in_mesh->mNumFaces) {
			const unsigned int iNumIndices = in_mesh->mFaces[base].mNumIndices;

			// doesn't catch degenerates but is quite fast
			unsigned int iNeed = 0;
			for (unsigned int v = 0; v < iNumIndices;++v)	{
				unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED == was_copied_to[index])	{
					iNeed++; 
				}
			}
			if (out_mesh->mNumVertices + iNeed > out_vertex_index)	{
				// don't use this face
				break;
			}

			vFaces.push_back(aiFace());
			aiFace& rFace = vFaces.back();

			// setup face type and number of indices
			rFace.mNumIndices = iNumIndices;
			rFace.mIndices = new unsigned int[iNumIndices];

			// need to update the output primitive types
			switch (rFace.mNumIndices)
			{
			case 1:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
				break;
			case 2:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
				break;
			case 3:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
				break;
			default:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
			}

			// and copy the contents of the old array, offset them by current base
			for (unsigned int v = 0; v < iNumIndices;++v) {
				const unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED != was_copied_to[index]) {
					rFace.mIndices[v] = was_copied_to[index];
					continue;
				}

				// copy positions
				out_mesh->mVertices[out_mesh->mNumVertices] = (in_mesh->mVertices[index]);

				// copy normals
				if (in_mesh->HasNormals()) {
					out_mesh->mNormals[out_mesh->mNumVertices] = (in_mesh->mNormals[index]);
				}

				// copy tangents/bi-tangents
				if (in_mesh->HasTangentsAndBitangents()) {
					out_mesh->mTangents[out_mesh->mNumVertices] = (in_mesh->mTangents[index]);
					out_mesh->mBitangents[out_mesh->mNumVertices] = (in_mesh->mBitangents[index]);
				}

				// texture coordinates
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
					if (in_mesh->HasTextureCoords( c)) {
						out_mesh->mTextureCoords[c][out_mesh->mNumVertices] = in_mesh->mTextureCoords[c][index];
					}
				}
				// vertex colors 
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
					if (in_mesh->HasVertexColors( c)) {
						out_mesh->mColors[c][out_mesh->mNumVertices] = in_mesh->mColors[c][index];
					}
				}
				// check whether we have bone weights assigned to this vertex
				rFace.mIndices[v] = out_mesh->mNumVertices;
				if (avPerVertexWeights) {
					VertexWeightTable& table = avPerVertexWeights[ out_mesh->mNumVertices ];
					for (VertexWeightTable::const_iterator iter = table.begin(), end = table.end(); iter != end;++iter) {
						// allocate the bone weight array if necessary and store it in the mBones field (HACK!)
						BoneWeightList* weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[(*iter).first]);
						if (!weight_list) {
							weight_list = new BoneWeightList();
							out_mesh->mBones[(*iter).first] = reinterpret_cast<aiBone*>(weight_list);
						}
						weight_list->push_back(aiVertexWeight(out_mesh->mNumVertices,(*iter).second));
					}
				}

				was_copied_to[index] = out_mesh->mNumVertices;
				out_mesh->mNumVertices++;
			}
			base++;
			if(out_mesh->mNumVertices == out_vertex_index) {
				// break here. The face is only added if it was complete
				break;
			}
		}

		// check which bones we'll need to create for this submesh
		if (in_mesh->HasBones()) {
			aiBone** ppCurrent = out_mesh->mBones;
			for (unsigned int k = 0; k < in_mesh->mNumBones;++k) {
				// check whether the bone exists
				BoneWeightList* const weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[k]);

				if (weight_list) {
					const aiBone* const bone_in = in_mesh->mBones[k];
					aiBone* const bone_out = new aiBone();
					*ppCurrent++ = bone_out;
					bone_out->mName = aiString(bone_in->mName);
					bone_out->mOffsetMatrix =bone_in->mOffsetMatrix;
					bone_out->mNumWeights = (unsigned int)weight_list->size();
					bone_out->mWeights = new aiVertexWeight[bone_out->mNumWeights];

					// copy the vertex weights
					::memcpy(bone_out->mWeights, &(*weight_list)[0],bone_out->mNumWeights * sizeof(aiVertexWeight));

					delete weight_list;
					out_mesh->mNumBones++;
				}
			}
		}

		// copy the face list to the mesh
		out_mesh->mFaces = new aiFace[vFaces.size()];
		out_mesh->mNumFaces = (unsigned int)vFaces.size();

		for (unsigned int p = 0; p < out_mesh->mNumFaces;++p) {
			out_mesh->mFaces[p] = vFaces[p];
		}

		// add the newly created mesh to the list
		source_mesh_map.push_back(std::make_pair(out_mesh,a));

		if (base == in_mesh->mNumFaces) {
			break;
		}
	}

	// delete the per-vertex weight list again
	delete[] avPerVertexWeights;

	// now delete the old mesh data
	delete in_mesh;
}